

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitParam.cpp
# Opt level: O0

void __thiscall rc::detail::ImplicitScope::~ImplicitScope(ImplicitScope *this)

{
  bool bVar1;
  reference this_00;
  reference pp_Var2;
  _func_void *destructor;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  ImplicitScope *this_local;
  
  this_00 = std::
            stack<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::vector<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::allocator<std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>_>_>
            ::top((stack<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::vector<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::allocator<std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>_>_>
                   *)m_scopes);
  __end2 = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::begin(this_00);
  destructor = (_func_void *)std::vector<void_(*)(),_std::allocator<void_(*)()>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
                                *)&destructor);
    if (!bVar1) break;
    pp_Var2 = __gnu_cxx::
              __normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
              ::operator*(&__end2);
    (**pp_Var2)();
    __gnu_cxx::__normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
    ::operator++(&__end2);
  }
  std::
  stack<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::vector<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::allocator<std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>_>_>
  ::pop((stack<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::vector<std::vector<void_(*)(),_std::allocator<void_(*)()>_>,_std::allocator<std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>_>_>
         *)m_scopes);
  return;
}

Assistant:

ImplicitScope::~ImplicitScope() {
  for (auto destructor : m_scopes.top()) {
    destructor();
  }
  m_scopes.pop();
}